

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O0

MockSupport * __thiscall MockSupport::getMockSupportScope(MockSupport *this,SimpleString *name)

{
  bool bVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  undefined4 extraout_var;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  SimpleString local_110;
  MockSupport *local_100;
  MockSupport *newMock;
  MockNamedValue local_f0;
  MockNamedValue local_a0;
  SimpleString local_50 [2];
  undefined1 local_30 [8];
  SimpleString mockingSupportName;
  SimpleString *name_local;
  MockSupport *this_local;
  
  mockingSupportName.bufferSize_ = (size_t)name;
  SimpleString::SimpleString((SimpleString *)local_30,"!!!$$$MockingSupportScope$$$!!!");
  SimpleString::operator+=((SimpleString *)local_30,(SimpleString *)mockingSupportName.bufferSize_);
  bVar1 = hasData(this,(SimpleString *)local_30);
  if (bVar1) {
    pUVar3 = UtestShell::getCurrent();
    getData(&local_a0,this,(SimpleString *)local_30);
    MockNamedValue::getType((MockNamedValue *)local_50);
    pcVar4 = SimpleString::asCharString(local_50);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[9])
              (pUVar3,"MockSupport",pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
               ,0x1c6,pTVar5);
    SimpleString::~SimpleString(local_50);
    MockNamedValue::~MockNamedValue(&local_a0);
    getData(&local_f0,this,(SimpleString *)local_30);
    this_local = (MockSupport *)MockNamedValue::getObjectPointer(&local_f0);
    MockNamedValue::~MockNamedValue(&local_f0);
  }
  else {
    iVar2 = clone(this,(__fn *)mockingSupportName.bufferSize_,__child_stack,in_ECX,in_R8);
    local_100 = (MockSupport *)CONCAT44(extraout_var,iVar2);
    SimpleString::SimpleString(&local_110,"MockSupport");
    setDataObject(this,(SimpleString *)local_30,&local_110,local_100);
    SimpleString::~SimpleString(&local_110);
    this_local = local_100;
  }
  newMock._4_4_ = 1;
  SimpleString::~SimpleString((SimpleString *)local_30);
  return this_local;
}

Assistant:

MockSupport* MockSupport::getMockSupportScope(const SimpleString& name)
{
    SimpleString mockingSupportName = MOCK_SUPPORT_SCOPE_PREFIX;
    mockingSupportName += name;

    if (hasData(mockingSupportName)) {
        STRCMP_EQUAL("MockSupport", getData(mockingSupportName).getType().asCharString());
        return (MockSupport*) getData(mockingSupportName).getObjectPointer();
    }

    MockSupport *newMock = clone(name);

    setDataObject(mockingSupportName, "MockSupport", newMock);
    return newMock;
}